

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_vfy.c
# Opt level: O0

X509_CRL * X509_CRL_diff(X509_CRL *base,X509_CRL *newer,EVP_PKEY *skey,EVP_MD *md,uint flags)

{
  int iVar1;
  int iVar2;
  int iVar3;
  X509_CRL *a;
  X509_NAME *pXVar4;
  OPENSSL_STACK *pOVar5;
  EVP_MD *in_RCX;
  EVP_PKEY *in_RDX;
  X509_CRL *in_RSI;
  X509_CRL *in_RDI;
  X509_REVOKED *rvtmp;
  X509_REVOKED *rvn;
  X509_EXTENSION *ext;
  stack_st_X509_REVOKED *revs;
  int i;
  X509_CRL *crl;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  OSSL_LIB_CTX *in_stack_ffffffffffffff80;
  undefined8 in_stack_ffffffffffffff88;
  OSSL_LIB_CTX *pOVar6;
  OSSL_LIB_CTX *in_stack_ffffffffffffff90;
  X509_REVOKED *local_60;
  ASN1_INTEGER *local_58;
  X509_EXTENSION *local_50;
  stack_st_X509_REVOKED *local_48;
  int local_3c;
  OSSL_LIB_CTX *local_38;
  EVP_MD *local_28;
  EVP_PKEY *local_20;
  X509_CRL *local_18;
  X509_CRL *local_10;
  
  iVar3 = (int)((ulong)in_stack_ffffffffffffff88 >> 0x20);
  local_38 = (OSSL_LIB_CTX *)0x0;
  local_48 = (stack_st_X509_REVOKED *)0x0;
  if ((in_RDI->base_crl_number == (ASN1_INTEGER *)0x0) &&
     (in_RSI->base_crl_number == (ASN1_INTEGER *)0x0)) {
    if ((in_RDI->crl_number == (ASN1_INTEGER *)0x0) || (in_RSI->crl_number == (ASN1_INTEGER *)0x0))
    {
      ERR_new();
      ERR_set_debug((char *)in_stack_ffffffffffffff90,iVar3,(char *)in_stack_ffffffffffffff80);
      ERR_set_error(0xb,0x82,(char *)0x0);
    }
    else {
      local_28 = in_RCX;
      local_20 = in_RDX;
      local_18 = in_RSI;
      local_10 = in_RDI;
      a = (X509_CRL *)X509_CRL_get_issuer(in_RDI);
      pXVar4 = X509_CRL_get_issuer(local_18);
      iVar1 = X509_NAME_cmp((X509_NAME *)a,(X509_NAME *)pXVar4);
      if (iVar1 == 0) {
        iVar1 = crl_extension_match(a,(X509_CRL *)in_stack_ffffffffffffff90,iVar3);
        if (iVar1 == 0) {
          ERR_new();
          ERR_set_debug((char *)in_stack_ffffffffffffff90,iVar3,(char *)in_stack_ffffffffffffff80);
          ERR_set_error(0xb,0x6e,(char *)0x0);
        }
        else {
          iVar1 = crl_extension_match(a,(X509_CRL *)in_stack_ffffffffffffff90,iVar3);
          if (iVar1 == 0) {
            ERR_new();
            ERR_set_debug((char *)in_stack_ffffffffffffff90,iVar3,(char *)in_stack_ffffffffffffff80)
            ;
            ERR_set_error(0xb,0x80,(char *)0x0);
          }
          else {
            iVar1 = ASN1_INTEGER_cmp((ASN1_INTEGER *)local_18->crl_number,
                                     (ASN1_INTEGER *)local_10->crl_number);
            if (iVar1 < 1) {
              ERR_new();
              ERR_set_debug((char *)in_stack_ffffffffffffff90,iVar3,
                            (char *)in_stack_ffffffffffffff80);
              ERR_set_error(0xb,0x84,(char *)0x0);
            }
            else if ((local_20 == (EVP_PKEY *)0x0) ||
                    ((iVar1 = X509_CRL_verify((X509_CRL *)local_10,local_20), 0 < iVar1 &&
                     (iVar1 = X509_CRL_verify((X509_CRL *)local_18,local_20), 0 < iVar1)))) {
              local_38 = (OSSL_LIB_CTX *)
                         X509_CRL_new_ex(in_stack_ffffffffffffff80,
                                         (char *)CONCAT44(in_stack_ffffffffffffff7c,
                                                          in_stack_ffffffffffffff78));
              if ((local_38 != (OSSL_LIB_CTX *)0x0) &&
                 (iVar1 = X509_CRL_set_version((X509_CRL *)local_38,1), iVar1 != 0)) {
                in_stack_ffffffffffffff90 = local_38;
                pXVar4 = X509_CRL_get_issuer(local_18);
                iVar1 = X509_CRL_set_issuer_name
                                  ((X509_CRL *)in_stack_ffffffffffffff90,(X509_NAME *)pXVar4);
                if (iVar1 != 0) {
                  pOVar6 = local_38;
                  X509_CRL_get0_lastUpdate(local_18);
                  iVar1 = X509_CRL_set1_lastUpdate
                                    ((X509_CRL *)
                                     CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                                     (ASN1_TIME *)0x2d16d1);
                  iVar3 = (int)((ulong)pOVar6 >> 0x20);
                  if (iVar1 != 0) {
                    in_stack_ffffffffffffff80 = local_38;
                    X509_CRL_get0_nextUpdate(local_18);
                    iVar1 = X509_CRL_set1_nextUpdate
                                      ((X509_CRL *)
                                       CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78)
                                       ,(ASN1_TIME *)0x2d16fc);
                    iVar3 = (int)((ulong)pOVar6 >> 0x20);
                    if (iVar1 != 0) {
                      iVar1 = X509_CRL_add1_ext_i2d
                                        ((X509_CRL *)local_38,0x8c,local_10->crl_number,1,0);
                      iVar3 = (int)((ulong)pOVar6 >> 0x20);
                      if (iVar1 != 0) {
                        local_3c = 0;
                        while (iVar3 = local_3c,
                              iVar1 = X509_CRL_get_ext_count((X509_CRL *)local_18), iVar3 < iVar1) {
                          local_50 = X509_CRL_get_ext((X509_CRL *)local_18,local_3c);
                          iVar1 = X509_CRL_add_ext((X509_CRL *)local_38,local_50,-1);
                          iVar3 = (int)((ulong)pOVar6 >> 0x20);
                          if (iVar1 == 0) goto LAB_002d1891;
                          local_3c = local_3c + 1;
                        }
                        local_48 = X509_CRL_get_REVOKED(local_18);
                        local_3c = 0;
                        while( true ) {
                          iVar1 = local_3c;
                          pOVar5 = ossl_check_const_X509_REVOKED_sk_type(local_48);
                          iVar2 = OPENSSL_sk_num(pOVar5);
                          iVar3 = (int)((ulong)pOVar6 >> 0x20);
                          if (iVar2 <= iVar1) break;
                          pOVar5 = ossl_check_const_X509_REVOKED_sk_type(local_48);
                          local_58 = (ASN1_INTEGER *)OPENSSL_sk_value(pOVar5,local_3c);
                          iVar3 = X509_CRL_get0_by_serial
                                            ((X509_CRL *)local_10,(X509_REVOKED **)&local_60,
                                             local_58);
                          if (iVar3 == 0) {
                            local_60 = X509_REVOKED_dup((X509_REVOKED *)0x2d1814);
                            iVar3 = (int)((ulong)pOVar6 >> 0x20);
                            if (local_60 == (X509_REVOKED *)0x0) goto LAB_002d1891;
                            iVar1 = X509_CRL_add0_revoked
                                              ((X509_CRL *)local_38,(X509_REVOKED *)local_60);
                            iVar3 = (int)((ulong)pOVar6 >> 0x20);
                            if (iVar1 == 0) {
                              X509_REVOKED_free((X509_REVOKED *)local_60);
                              goto LAB_002d1891;
                            }
                          }
                          local_3c = local_3c + 1;
                        }
                        if (((local_20 == (EVP_PKEY *)0x0) || (local_28 == (EVP_MD *)0x0)) ||
                           (iVar1 = X509_CRL_sign((X509_CRL *)local_38,local_20,local_28),
                           iVar1 != 0)) {
                          return (X509_CRL *)local_38;
                        }
                      }
                    }
                  }
                }
              }
LAB_002d1891:
              ERR_new();
              ERR_set_debug((char *)in_stack_ffffffffffffff90,iVar3,
                            (char *)in_stack_ffffffffffffff80);
              ERR_set_error(0xb,0xc0100,(char *)0x0);
              X509_CRL_free((X509_CRL *)local_38);
            }
            else {
              ERR_new();
              ERR_set_debug((char *)in_stack_ffffffffffffff90,iVar3,
                            (char *)in_stack_ffffffffffffff80);
              ERR_set_error(0xb,0x83,(char *)0x0);
            }
          }
        }
      }
      else {
        ERR_new();
        ERR_set_debug((char *)in_stack_ffffffffffffff90,iVar3,(char *)in_stack_ffffffffffffff80);
        ERR_set_error(0xb,0x81,(char *)0x0);
      }
    }
  }
  else {
    ERR_new();
    ERR_set_debug((char *)in_stack_ffffffffffffff90,iVar3,(char *)in_stack_ffffffffffffff80);
    ERR_set_error(0xb,0x7f,(char *)0x0);
  }
  return (X509_CRL *)0x0;
}

Assistant:

X509_CRL *X509_CRL_diff(X509_CRL *base, X509_CRL *newer,
                        EVP_PKEY *skey, const EVP_MD *md, unsigned int flags)
{
    X509_CRL *crl = NULL;
    int i;

    STACK_OF(X509_REVOKED) *revs = NULL;
    /* CRLs can't be delta already */
    if (base->base_crl_number != NULL || newer->base_crl_number != NULL) {
        ERR_raise(ERR_LIB_X509, X509_R_CRL_ALREADY_DELTA);
        return NULL;
    }
    /* Base and new CRL must have a CRL number */
    if (base->crl_number == NULL || newer->crl_number == NULL) {
        ERR_raise(ERR_LIB_X509, X509_R_NO_CRL_NUMBER);
        return NULL;
    }
    /* Issuer names must match */
    if (X509_NAME_cmp(X509_CRL_get_issuer(base),
                      X509_CRL_get_issuer(newer)) != 0) {
        ERR_raise(ERR_LIB_X509, X509_R_ISSUER_MISMATCH);
        return NULL;
    }
    /* AKID and IDP must match */
    if (!crl_extension_match(base, newer, NID_authority_key_identifier)) {
        ERR_raise(ERR_LIB_X509, X509_R_AKID_MISMATCH);
        return NULL;
    }
    if (!crl_extension_match(base, newer, NID_issuing_distribution_point)) {
        ERR_raise(ERR_LIB_X509, X509_R_IDP_MISMATCH);
        return NULL;
    }
    /* Newer CRL number must exceed full CRL number */
    if (ASN1_INTEGER_cmp(newer->crl_number, base->crl_number) <= 0) {
        ERR_raise(ERR_LIB_X509, X509_R_NEWER_CRL_NOT_NEWER);
        return NULL;
    }
    /* CRLs must verify */
    if (skey != NULL && (X509_CRL_verify(base, skey) <= 0 ||
                         X509_CRL_verify(newer, skey) <= 0)) {
        ERR_raise(ERR_LIB_X509, X509_R_CRL_VERIFY_FAILURE);
        return NULL;
    }
    /* Create new CRL */
    crl = X509_CRL_new_ex(base->libctx, base->propq);
    if (crl == NULL || !X509_CRL_set_version(crl, X509_CRL_VERSION_2))
        goto memerr;
    /* Set issuer name */
    if (!X509_CRL_set_issuer_name(crl, X509_CRL_get_issuer(newer)))
        goto memerr;

    if (!X509_CRL_set1_lastUpdate(crl, X509_CRL_get0_lastUpdate(newer)))
        goto memerr;
    if (!X509_CRL_set1_nextUpdate(crl, X509_CRL_get0_nextUpdate(newer)))
        goto memerr;

    /* Set base CRL number: must be critical */
    if (!X509_CRL_add1_ext_i2d(crl, NID_delta_crl, base->crl_number, 1, 0))
        goto memerr;

    /*
     * Copy extensions across from newest CRL to delta: this will set CRL
     * number to correct value too.
     */
    for (i = 0; i < X509_CRL_get_ext_count(newer); i++) {
        X509_EXTENSION *ext = X509_CRL_get_ext(newer, i);

        if (!X509_CRL_add_ext(crl, ext, -1))
            goto memerr;
    }

    /* Go through revoked entries, copying as needed */
    revs = X509_CRL_get_REVOKED(newer);

    for (i = 0; i < sk_X509_REVOKED_num(revs); i++) {
        X509_REVOKED *rvn, *rvtmp;

        rvn = sk_X509_REVOKED_value(revs, i);
        /*
         * Add only if not also in base.
         * Need something cleverer here for some more complex CRLs covering
         * multiple CAs.
         */
        if (!X509_CRL_get0_by_serial(base, &rvtmp, &rvn->serialNumber)) {
            rvtmp = X509_REVOKED_dup(rvn);
            if (rvtmp == NULL)
                goto memerr;
            if (!X509_CRL_add0_revoked(crl, rvtmp)) {
                X509_REVOKED_free(rvtmp);
                goto memerr;
            }
        }
    }

    if (skey != NULL && md != NULL && !X509_CRL_sign(crl, skey, md))
        goto memerr;

    return crl;

 memerr:
    ERR_raise(ERR_LIB_X509, ERR_R_MALLOC_FAILURE);
    X509_CRL_free(crl);
    return NULL;
}